

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

char * xml_print_ns(xmlpr_ctx *pctx,char *ns,char *new_prefix,uint32_t prefix_opts)

{
  int iVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *local_48;
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t i;
  uint32_t prefix_opts_local;
  char *new_prefix_local;
  char *ns_local;
  xmlpr_ctx *pctx_local;
  
  local_30 = (pctx->ns).count;
  local_2c = prefix_opts;
  _i = new_prefix;
  new_prefix_local = ns;
  ns_local = (char *)pctx;
  do {
    if (local_30 == 0) {
LAB_00159f2b:
      pcVar3 = "";
      if (_i == (char *)0x0) {
        local_48 = "";
      }
      else {
        pcVar3 = ":";
        local_48 = _i;
      }
      ly_print_(*(ly_out **)ns_local," xmlns%s%s=\"%s\"",pcVar3,local_48,new_prefix_local);
      if ((_i == (char *)0x0) ||
         (LVar2 = lydict_insert(*(ly_ctx **)(ns_local + 0x10),_i,0,(char **)&i), LVar2 == LY_SUCCESS
         )) {
        LVar2 = ly_set_add((ly_set *)(ns_local + 0x18),_i,'\x01',(uint32_t *)0x0);
        if (LVar2 == LY_SUCCESS) {
          LVar2 = ly_set_add((ly_set *)(ns_local + 0x28),new_prefix_local,'\x01',&local_30);
          if (LVar2 == LY_SUCCESS) {
            pctx_local = *(xmlpr_ctx **)(*(long *)(ns_local + 0x20) + (ulong)local_30 * 8);
          }
          else {
            pctx_local = (xmlpr_ctx *)0x0;
          }
        }
        else {
          pctx_local = (xmlpr_ctx *)0x0;
        }
      }
      else {
        pctx_local = (xmlpr_ctx *)0x0;
      }
      return (char *)pctx_local;
    }
    if (_i == (char *)0x0) {
      if (*(long *)(*(long *)(ns_local + 0x20) + (ulong)(local_30 - 1) * 8) == 0) {
        iVar1 = strcmp(*(char **)(*(long *)(ns_local + 0x30) + (ulong)(local_30 - 1) * 8),
                       new_prefix_local);
        if (iVar1 == 0) {
          return *(char **)(*(long *)(ns_local + 0x20) + (ulong)(local_30 - 1) * 8);
        }
        goto LAB_00159f2b;
      }
    }
    else {
      iVar1 = strcmp(*(char **)(*(long *)(ns_local + 0x30) + (ulong)(local_30 - 1) * 8),
                     new_prefix_local);
      if (((iVar1 == 0) && (*(long *)(*(long *)(ns_local + 0x20) + (ulong)(local_30 - 1) * 8) != 0))
         && ((iVar1 = strcmp(*(char **)(*(long *)(ns_local + 0x20) + (ulong)(local_30 - 1) * 8),_i),
             iVar1 == 0 || ((local_2c & 1) == 0)))) {
        return *(char **)(*(long *)(ns_local + 0x20) + (ulong)(local_30 - 1) * 8);
      }
    }
    local_30 = local_30 - 1;
  } while( true );
}

Assistant:

static const char *
xml_print_ns(struct xmlpr_ctx *pctx, const char *ns, const char *new_prefix, uint32_t prefix_opts)
{
    uint32_t i;

    for (i = pctx->ns.count; i > 0; --i) {
        if (!new_prefix) {
            /* find default namespace */
            if (!pctx->prefix.objs[i - 1]) {
                if (!strcmp(pctx->ns.objs[i - 1], ns)) {
                    /* matching default namespace */
                    return pctx->prefix.objs[i - 1];
                }
                /* not matching default namespace */
                break;
            }
        } else {
            /* find prefixed namespace */
            if (!strcmp(pctx->ns.objs[i - 1], ns)) {
                if (!pctx->prefix.objs[i - 1]) {
                    /* default namespace is not interesting */
                    continue;
                }

                if (!strcmp(pctx->prefix.objs[i - 1], new_prefix) || !(prefix_opts & LYXML_PREFIX_REQUIRED)) {
                    /* the same prefix or can be any */
                    return pctx->prefix.objs[i - 1];
                }
            }
        }
    }

    /* suitable namespace not found, must be printed */
    ly_print_(pctx->out, " xmlns%s%s=\"%s\"", new_prefix ? ":" : "", new_prefix ? new_prefix : "", ns);

    /* and added into namespaces */
    if (new_prefix) {
        LY_CHECK_RET(lydict_insert(pctx->ctx, new_prefix, 0, &new_prefix), NULL);
    }
    LY_CHECK_RET(ly_set_add(&pctx->prefix, (void *)new_prefix, 1, NULL), NULL);
    LY_CHECK_RET(ly_set_add(&pctx->ns, (void *)ns, 1, &i), NULL);

    /* return it */
    return pctx->prefix.objs[i];
}